

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O1

void __thiscall oomProblems_oomFiles_Test::TestBody(oomProblems_oomFiles_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ParamType *pPVar3;
  uint64_t match_flags;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_4;
  TrueWithString gtest_msg;
  AssertionResult gtest_ar_;
  string cdata;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  AssertHelper local_b0;
  string local_a8;
  internal local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78 [3];
  string local_60;
  string local_40;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"oom","");
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  loadFailureFile(&local_60,&local_a8,*pPVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_80[0] = (internal)(local_60._M_string_length != 0);
  local_78[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60._M_string_length == 0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,local_80,(AssertionResult *)"cdata.empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/fuzz_issue_tests.cpp"
               ,0x70,local_a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
    if (local_78[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_78,local_78[0]);
    }
  }
  else {
    local_a8.field_2._8_8_ = 0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,local_60._M_dataplus._M_p,
                 local_60._M_dataplus._M_p + local_60._M_string_length);
      match_flags = units::getDefaultFlags();
      units::unit_from_string(&local_40,match_flags);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(fuzzFailures, rtripconversions6)
{
    std::string tstring = "V\xb2";
    tstring += "+*";
    auto u1 = unit_from_string(tstring);
    EXPECT_TRUE(is_error(u1));
}